

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

int64_t finer_search_wiener(RestSearchCtxt *rsc,RestorationTileLimits *limits,
                           RestorationUnitInfo *rui,int wiener_win)

{
  short sVar1;
  bool bVar2;
  long lVar3;
  int in_ECX;
  long in_RDX;
  long in_RDI;
  int skip_1;
  int p_1;
  int skip;
  int p;
  int s;
  int start_step;
  WienerInfo *plane_wiener;
  int tap_max [3];
  int tap_min [3];
  int64_t err2;
  int64_t err;
  int plane_off;
  RestorationUnitInfo *in_stack_000012a0;
  RestorationTileLimits *in_stack_000012a8;
  RestSearchCtxt *in_stack_000012b0;
  int local_6c;
  int local_64;
  int local_60;
  int local_50 [6];
  int64_t local_38;
  int64_t local_30;
  int local_28;
  long local_20;
  long local_10;
  int64_t local_8;
  
  local_28 = 7 - in_ECX >> 1;
  local_20 = in_RDX;
  local_10 = in_RDI;
  local_8 = try_restoration_unit(in_stack_000012b0,in_stack_000012a8,in_stack_000012a0);
  local_30 = local_8;
  if ((*(byte *)(*(long *)(local_10 + 0x38) + 0x3a) & 1) == 0) {
    local_50[3] = -5;
    local_50[4] = -0x17;
    local_50[5] = 0xffffffef;
    local_50[0] = 10;
    local_50[1] = 8;
    local_50[2] = 0x2e;
    lVar3 = local_20 + 0x10;
    for (local_60 = 4; local_60 != 0; local_60 = local_60 >> 1) {
      for (local_64 = local_28; sVar1 = (short)local_60, local_64 < 3; local_64 = local_64 + 1) {
        bVar2 = false;
        do {
          if (*(short *)(local_20 + 0x20 + (long)local_64 * 2) - local_60 <
              local_50[(long)local_64 + 3]) break;
          *(short *)(local_20 + 0x20 + (long)local_64 * 2) =
               *(short *)(local_20 + 0x20 + (long)local_64 * 2) - sVar1;
          *(short *)(local_20 + 0x20 + (long)(6 - local_64) * 2) =
               *(short *)(local_20 + 0x20 + (long)(6 - local_64) * 2) - sVar1;
          *(short *)(local_20 + 0x26) = *(short *)(local_20 + 0x26) + (short)(local_60 << 1);
          local_38 = try_restoration_unit(in_stack_000012b0,in_stack_000012a8,in_stack_000012a0);
          if (local_30 < local_38) {
            *(short *)(local_20 + 0x20 + (long)local_64 * 2) =
                 *(short *)(local_20 + 0x20 + (long)local_64 * 2) + sVar1;
            *(short *)(local_20 + 0x20 + (long)(6 - local_64) * 2) =
                 *(short *)(local_20 + 0x20 + (long)(6 - local_64) * 2) + sVar1;
            *(short *)(local_20 + 0x26) = *(short *)(local_20 + 0x26) + sVar1 * -2;
            break;
          }
          local_30 = local_38;
          bVar2 = true;
        } while (local_60 == 4);
        if (bVar2) break;
        do {
          if (local_50[local_64] < *(short *)(local_20 + 0x20 + (long)local_64 * 2) + local_60)
          break;
          *(short *)(local_20 + 0x20 + (long)local_64 * 2) =
               *(short *)(local_20 + 0x20 + (long)local_64 * 2) + sVar1;
          *(short *)(local_20 + 0x20 + (long)(6 - local_64) * 2) =
               *(short *)(local_20 + 0x20 + (long)(6 - local_64) * 2) + sVar1;
          *(short *)(local_20 + 0x26) = *(short *)(local_20 + 0x26) + sVar1 * -2;
          local_38 = try_restoration_unit(in_stack_000012b0,in_stack_000012a8,in_stack_000012a0);
          if (local_30 < local_38) {
            *(short *)(local_20 + 0x20 + (long)local_64 * 2) =
                 *(short *)(local_20 + 0x20 + (long)local_64 * 2) - sVar1;
            *(short *)(local_20 + 0x20 + (long)(6 - local_64) * 2) =
                 *(short *)(local_20 + 0x20 + (long)(6 - local_64) * 2) - sVar1;
            *(short *)(local_20 + 0x26) = *(short *)(local_20 + 0x26) + (short)(local_60 << 1);
            break;
          }
          local_30 = local_38;
        } while (local_60 == 4);
      }
      for (local_6c = local_28; local_6c < 3; local_6c = local_6c + 1) {
        bVar2 = false;
        do {
          if (*(short *)(lVar3 + (long)local_6c * 2) - local_60 < local_50[(long)local_6c + 3])
          break;
          *(short *)(lVar3 + (long)local_6c * 2) = *(short *)(lVar3 + (long)local_6c * 2) - sVar1;
          *(short *)(lVar3 + (long)(6 - local_6c) * 2) =
               *(short *)(lVar3 + (long)(6 - local_6c) * 2) - sVar1;
          *(short *)(local_20 + 0x16) = *(short *)(local_20 + 0x16) + (short)(local_60 << 1);
          local_38 = try_restoration_unit(in_stack_000012b0,in_stack_000012a8,in_stack_000012a0);
          if (local_30 < local_38) {
            *(short *)(lVar3 + (long)local_6c * 2) = *(short *)(lVar3 + (long)local_6c * 2) + sVar1;
            *(short *)(lVar3 + (long)(6 - local_6c) * 2) =
                 *(short *)(lVar3 + (long)(6 - local_6c) * 2) + sVar1;
            *(short *)(local_20 + 0x16) = *(short *)(local_20 + 0x16) + sVar1 * -2;
            break;
          }
          local_30 = local_38;
          bVar2 = true;
        } while (local_60 == 4);
        if (bVar2) break;
        do {
          if (local_50[local_6c] < *(short *)(lVar3 + (long)local_6c * 2) + local_60) break;
          *(short *)(lVar3 + (long)local_6c * 2) = *(short *)(lVar3 + (long)local_6c * 2) + sVar1;
          *(short *)(lVar3 + (long)(6 - local_6c) * 2) =
               *(short *)(lVar3 + (long)(6 - local_6c) * 2) + sVar1;
          *(short *)(local_20 + 0x16) = *(short *)(local_20 + 0x16) + sVar1 * -2;
          local_38 = try_restoration_unit(in_stack_000012b0,in_stack_000012a8,in_stack_000012a0);
          if (local_30 < local_38) {
            *(short *)(lVar3 + (long)local_6c * 2) = *(short *)(lVar3 + (long)local_6c * 2) - sVar1;
            *(short *)(lVar3 + (long)(6 - local_6c) * 2) =
                 *(short *)(lVar3 + (long)(6 - local_6c) * 2) - sVar1;
            *(short *)(local_20 + 0x16) = *(short *)(local_20 + 0x16) + (short)(local_60 << 1);
            break;
          }
          local_30 = local_38;
        } while (local_60 == 4);
      }
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

static int64_t finer_search_wiener(const RestSearchCtxt *rsc,
                                   const RestorationTileLimits *limits,
                                   RestorationUnitInfo *rui, int wiener_win) {
  const int plane_off = (WIENER_WIN - wiener_win) >> 1;
  int64_t err = try_restoration_unit(rsc, limits, rui);

  if (rsc->lpf_sf->disable_wiener_coeff_refine_search) return err;

  // Refinement search around the wiener filter coefficients.
  int64_t err2;
  int tap_min[] = { WIENER_FILT_TAP0_MINV, WIENER_FILT_TAP1_MINV,
                    WIENER_FILT_TAP2_MINV };
  int tap_max[] = { WIENER_FILT_TAP0_MAXV, WIENER_FILT_TAP1_MAXV,
                    WIENER_FILT_TAP2_MAXV };

  WienerInfo *plane_wiener = &rui->wiener_info;

  const int start_step = 4;
  for (int s = start_step; s >= 1; s >>= 1) {
    for (int p = plane_off; p < WIENER_HALFWIN; ++p) {
      int skip = 0;
      do {
        if (plane_wiener->hfilter[p] - s >= tap_min[p]) {
          plane_wiener->hfilter[p] -= s;
          plane_wiener->hfilter[WIENER_WIN - p - 1] -= s;
          plane_wiener->hfilter[WIENER_HALFWIN] += 2 * s;
          err2 = try_restoration_unit(rsc, limits, rui);
          if (err2 > err) {
            plane_wiener->hfilter[p] += s;
            plane_wiener->hfilter[WIENER_WIN - p - 1] += s;
            plane_wiener->hfilter[WIENER_HALFWIN] -= 2 * s;
          } else {
            err = err2;
            skip = 1;
            // At the highest step size continue moving in the same direction
            if (s == start_step) continue;
          }
        }
        break;
      } while (1);
      if (skip) break;
      do {
        if (plane_wiener->hfilter[p] + s <= tap_max[p]) {
          plane_wiener->hfilter[p] += s;
          plane_wiener->hfilter[WIENER_WIN - p - 1] += s;
          plane_wiener->hfilter[WIENER_HALFWIN] -= 2 * s;
          err2 = try_restoration_unit(rsc, limits, rui);
          if (err2 > err) {
            plane_wiener->hfilter[p] -= s;
            plane_wiener->hfilter[WIENER_WIN - p - 1] -= s;
            plane_wiener->hfilter[WIENER_HALFWIN] += 2 * s;
          } else {
            err = err2;
            // At the highest step size continue moving in the same direction
            if (s == start_step) continue;
          }
        }
        break;
      } while (1);
    }
    for (int p = plane_off; p < WIENER_HALFWIN; ++p) {
      int skip = 0;
      do {
        if (plane_wiener->vfilter[p] - s >= tap_min[p]) {
          plane_wiener->vfilter[p] -= s;
          plane_wiener->vfilter[WIENER_WIN - p - 1] -= s;
          plane_wiener->vfilter[WIENER_HALFWIN] += 2 * s;
          err2 = try_restoration_unit(rsc, limits, rui);
          if (err2 > err) {
            plane_wiener->vfilter[p] += s;
            plane_wiener->vfilter[WIENER_WIN - p - 1] += s;
            plane_wiener->vfilter[WIENER_HALFWIN] -= 2 * s;
          } else {
            err = err2;
            skip = 1;
            // At the highest step size continue moving in the same direction
            if (s == start_step) continue;
          }
        }
        break;
      } while (1);
      if (skip) break;
      do {
        if (plane_wiener->vfilter[p] + s <= tap_max[p]) {
          plane_wiener->vfilter[p] += s;
          plane_wiener->vfilter[WIENER_WIN - p - 1] += s;
          plane_wiener->vfilter[WIENER_HALFWIN] -= 2 * s;
          err2 = try_restoration_unit(rsc, limits, rui);
          if (err2 > err) {
            plane_wiener->vfilter[p] -= s;
            plane_wiener->vfilter[WIENER_WIN - p - 1] -= s;
            plane_wiener->vfilter[WIENER_HALFWIN] += 2 * s;
          } else {
            err = err2;
            // At the highest step size continue moving in the same direction
            if (s == start_step) continue;
          }
        }
        break;
      } while (1);
    }
  }
  return err;
}